

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transmitter_PDU::Decode(Transmitter_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  char local_5b;
  ushort local_5a;
  char local_57;
  byte local_56;
  undefined1 local_55;
  KOCTET o_1;
  KUINT16 i_1;
  KOCTET o;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Transmitter_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x68) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Radio_Communications_Header::Decode
            (&this->super_Radio_Communications_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,&(this->m_RadioEntityType).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8TransmitterState);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8InputSource);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding1);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_AntennaLocation).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16AntennaPatternType);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16AntennaPatternLength);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui64Freq);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32TransmitFreqBW);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32Power);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_ModulationType).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_CryptoSystem).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8LengthOfModulationParam);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding2);
  KDataStream::operator>>(pKVar2,&this->m_ui8Padding3);
  for (local_56 = 0; local_56 < this->m_ui8LengthOfModulationParam; local_56 = local_56 + 1) {
    KDataStream::operator>>(pKStack_18,&local_57);
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vModulationParams,&local_57);
  }
  for (local_5a = 0; local_5a < this->m_ui16AntennaPatternLength; local_5a = local_5a + 1) {
    KDataStream::operator>>(pKStack_18,&local_5b);
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vAntennaPattern,&local_5b);
  }
  return;
}

Assistant:

void Transmitter_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < TRANSMITTER_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Radio_Communications_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RadioEntityType
           >> m_ui8TransmitterState
           >> m_ui8InputSource
           >> m_ui16Padding1
           >> KDIS_STREAM m_AntennaLocation
           >> m_ui16AntennaPatternType
           >> m_ui16AntennaPatternLength
           >> m_ui64Freq
           >> m_f32TransmitFreqBW
           >> m_f32Power
           >> KDIS_STREAM m_ModulationType
           >> KDIS_STREAM m_CryptoSystem
           >> m_ui8LengthOfModulationParam
           >> m_ui16Padding2
           >> m_ui8Padding3;

    for( KUINT8 i = 0; i < m_ui8LengthOfModulationParam; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vModulationParams.push_back( o );
    }

    for( KUINT16 i = 0; i < m_ui16AntennaPatternLength; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vAntennaPattern.push_back( o );
    }
}